

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor2008.h
# Opt level: O2

void __thiscall
FastPForLib::PFor2008::encodeArray
          (PFor2008 *this,uint32_t *in,size_t len,uint32_t *out,size_t *nvalue)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  uint32_t *out_00;
  long lVar5;
  bool bVar6;
  size_t thisnvalue;
  PFor2008 *local_40;
  ulong local_38;
  
  out_00 = out + 1;
  *out = (uint32_t)len;
  uVar3 = len + 0xffffff >> 0x18;
  sVar2 = 1;
  uVar4 = 0x1000000;
  lVar5 = 0;
  local_40 = this;
  local_38 = len;
  while( true ) {
    uVar1 = uVar4;
    if (local_38 < uVar4) {
      uVar1 = local_38;
    }
    bVar6 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar6) break;
    thisnvalue = *nvalue - sVar2;
    __encodeArray(local_40,in,uVar1 + lVar5,out_00,&thisnvalue);
    uVar4 = uVar4 + 0x1000000;
    lVar5 = lVar5 + -0x1000000;
    in = in + 0x1000000;
    sVar2 = sVar2 + thisnvalue;
    out_00 = out_00 + thisnvalue;
  }
  *nvalue = sVar2;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t len, uint32_t *out,
                   size_t &nvalue) override {
    *out++ = static_cast<uint32_t>(len);
#ifndef NDEBUG
    const uint32_t *const finalin(in + len);
#endif
    const uint32_t maxsize = (1U << (32 - blocksizeinbits - 1));
    size_t totalnvalue(1);
    // for (size_t i = 0; i < len; i += maxsize)
    for (size_t j = 0; j < (len + maxsize - 1U) / maxsize; ++j) {
      size_t i = j << (32 - blocksizeinbits - 1);
      size_t l = maxsize;
      if (i + maxsize > len) {
        l = len - i;
        assert(l <= maxsize);
      }
      size_t thisnvalue = nvalue - totalnvalue;
      assert(in + i + l <= finalin);
      __encodeArray(&in[i], l, out, thisnvalue);
      totalnvalue += thisnvalue;
      assert(totalnvalue <= nvalue);
      out += thisnvalue;
    }
    nvalue = totalnvalue;
  }